

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

isminetype __thiscall wallet::CWallet::IsMine(CWallet *this,CTxDestination *dest)

{
  isminetype iVar1;
  long in_FS_OFFSET;
  direct_or_indirect local_38;
  uint local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  GetScriptForDestination((CScript *)&local_38.indirect_contents,dest);
  iVar1 = IsMine(this,(CScript *)&local_38.indirect_contents);
  if (0x1c < local_1c) {
    free(local_38.indirect_contents.indirect);
    local_38.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

isminetype CWallet::IsMine(const CTxDestination& dest) const
{
    AssertLockHeld(cs_wallet);
    return IsMine(GetScriptForDestination(dest));
}